

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::AddInterfaceDepends
          (cmComputeTargetDepends *this,int depender_index,cmGeneratorTarget *dependee,
          string *config,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *emitted)

{
  cmLinkInterface *pcVar1;
  pointer dependee_name;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  
  pcVar1 = cmGeneratorTarget::GetLinkInterface
                     (dependee,config,
                      (this->Targets).
                      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[depender_index]);
  if (pcVar1 != (cmLinkInterface *)0x0) {
    for (dependee_name =
              (pcVar1->super_cmLinkInterfaceLibraries).Libraries.
              super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
              super__Vector_impl_data._M_start;
        dependee_name !=
        (pcVar1->super_cmLinkInterfaceLibraries).Libraries.
        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
        _M_finish; dependee_name = dependee_name + 1) {
      pVar2 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)emitted,&dependee_name->super_string);
      if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        AddTargetDepend(this,depender_index,dependee_name,true);
        AddInterfaceDepends(this,depender_index,dependee_name,config,emitted);
      }
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddInterfaceDepends(
  int depender_index, const cmGeneratorTarget* dependee,
  const std::string& config, std::set<std::string>& emitted)
{
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (cmLinkInterface const* iface =
        dependee->GetLinkInterface(config, depender)) {
    for (std::vector<cmLinkItem>::const_iterator lib =
           iface->Libraries.begin();
         lib != iface->Libraries.end(); ++lib) {
      // Don't emit the same library twice for this target.
      if (emitted.insert(*lib).second) {
        this->AddTargetDepend(depender_index, *lib, true);
        this->AddInterfaceDepends(depender_index, *lib, config, emitted);
      }
    }
  }
}